

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O0

ThresholdAlgorithmResult *
topk_algorithms::threshold_algorithm
          (ThresholdAlgorithmResult *__return_storage_ptr__,Problem *problem,RankSize k)

{
  bool bVar1;
  Rank *rank;
  reference pvVar2;
  Value VVar3;
  unsigned_long *puVar4;
  Count CVar5;
  value_type *pvVar6;
  Entry *this;
  size_type sVar7;
  Key KVar8;
  ulong uVar9;
  size_type sVar10;
  RankSize RVar11;
  reference __b;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar12;
  KeyValue local_140;
  _Node_iterator_base<unsigned_long,_false> local_130;
  undefined1 local_128;
  Key local_120;
  Value local_118;
  Value value;
  undefined1 local_108 [4];
  int j;
  KeyValue record;
  Entry *top_record;
  value_type *q;
  size_t i;
  ThresholdAlgorithmStats *stats;
  TopK *topk;
  undefined1 local_c0 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  processed_keys;
  RankSize rank_size;
  int local_68;
  int i_1;
  size_type local_58;
  Count m;
  Value head_sum;
  vector<Queue,_std::allocator<Queue>_> queues;
  Count entries;
  Count largest_rank;
  RankSize k_local;
  Problem *problem_local;
  ThresholdAlgorithmResult *result;
  
  entries = 0;
  queues.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  largest_rank = k;
  k_local = (RankSize)problem;
  problem_local = (Problem *)__return_storage_ptr__;
  std::vector<Queue,_std::allocator<Queue>_>::vector
            ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
  m = 0;
  local_58 = (*(code *)**(undefined8 **)k_local)();
  std::vector<Queue,_std::allocator<Queue>_>::reserve
            ((vector<Queue,_std::allocator<Queue>_> *)&head_sum,local_58);
  for (local_68 = 0; (ulong)(long)local_68 < local_58; local_68 = local_68 + 1) {
    rank = (Rank *)(**(code **)(*(long *)k_local + 8))(k_local,(long)local_68);
    threshold_algorithm(topk_algorithms::Problem_const*,unsigned_long)::Queue::Queue(rank::
    Rank_const__(&rank_size,rank);
    std::vector<Queue,_std::allocator<Queue>_>::push_back
              ((vector<Queue,_std::allocator<Queue>_> *)&head_sum,(value_type *)&rank_size);
    pvVar2 = std::vector<Queue,_std::allocator<Queue>_>::back
                       ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
    bVar1 = threshold_algorithm::Queue::empty((Queue *)pvVar2);
    if (bVar1) {
      std::vector<Queue,_std::allocator<Queue>_>::pop_back
                ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
    }
    else {
      pvVar2 = std::vector<Queue,_std::allocator<Queue>_>::back
                         ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
      VVar3 = threshold_algorithm::Queue::head_value((Queue *)pvVar2);
      m = m + VVar3;
      pvVar2 = std::vector<Queue,_std::allocator<Queue>_>::back
                         ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
      processed_keys._M_h._M_single_bucket =
           (__node_base_ptr)::rank::Rank::size((Rank *)pvVar2->_index);
      puVar4 = std::max<unsigned_long>
                         (&entries,(unsigned_long *)&processed_keys._M_h._M_single_bucket);
      entries = *puVar4;
      queues.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)&(queues.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage)->_rank +
                    (long)&(processed_keys._M_h._M_single_bucket)->_M_nxt);
    }
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_c0);
  ThresholdAlgorithmResult::ThresholdAlgorithmResult(__return_storage_ptr__);
  TopK::k(&__return_storage_ptr__->topk,largest_rank);
  (__return_storage_ptr__->stats).k = largest_rank;
  CVar5 = (*(code *)**(undefined8 **)k_local)();
  (__return_storage_ptr__->stats).num_ranks = CVar5;
  (__return_storage_ptr__->stats).largest_rank = entries;
  (__return_storage_ptr__->stats).entries =
       (Count)queues.super__Vector_base<Queue,_std::allocator<Queue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  q = (value_type *)0x0;
  while (pvVar6 = (value_type *)
                  std::vector<Queue,_std::allocator<Queue>_>::size
                            ((vector<Queue,_std::allocator<Queue>_> *)&head_sum), q < pvVar6) {
    pvVar2 = std::vector<Queue,_std::allocator<Queue>_>::at
                       ((vector<Queue,_std::allocator<Queue>_> *)&head_sum,(size_type)q);
    this = threshold_algorithm::Queue::next((Queue *)pvVar2);
    VVar3 = threshold_algorithm::Queue::head_value_drop((Queue *)pvVar2);
    m = m - VVar3;
    if (this == (Entry *)0x0) {
      pvVar2 = std::vector<Queue,_std::allocator<Queue>_>::operator[]
                         ((vector<Queue,_std::allocator<Queue>_> *)&head_sum,(size_type)q);
      __b = std::vector<Queue,_std::allocator<Queue>_>::back
                      ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
      std::
      swap<topk_algorithms::threshold_algorithm(topk_algorithms::Problem_const*,unsigned_long)::Queue>
                (pvVar2,__b);
      std::vector<Queue,_std::allocator<Queue>_>::pop_back
                ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
      pvVar6 = (value_type *)
               std::vector<Queue,_std::allocator<Queue>_>::size
                         ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
      if (pvVar6 <= q) {
        q = (value_type *)0x0;
      }
    }
    else {
      record._value = ::rank::Entry::key(this);
      sVar7 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)local_c0,&record._value);
      if (sVar7 == 0) {
        (__return_storage_ptr__->stats).ordered_access_hit =
             (__return_storage_ptr__->stats).ordered_access_hit + 1;
        KVar8 = ::rank::Entry::key(this);
        VVar3 = ::rank::Entry::value(this);
        ::rank::KeyValue::KeyValue((KeyValue *)local_108,KVar8,VVar3);
        for (value._4_4_ = 0; uVar9 = (ulong)value._4_4_,
            sVar10 = std::vector<Queue,_std::allocator<Queue>_>::size
                               ((vector<Queue,_std::allocator<Queue>_> *)&head_sum), uVar9 < sVar10;
            value._4_4_ = value._4_4_ + 1) {
          if (q != (value_type *)(long)value._4_4_) {
            pvVar2 = std::vector<Queue,_std::allocator<Queue>_>::operator[]
                               ((vector<Queue,_std::allocator<Queue>_> *)&head_sum,(long)value._4_4_
                               );
            KVar8 = ::rank::KeyValue::key((KeyValue *)local_108);
            local_118 = threshold_algorithm::Queue::value_of((Queue *)pvVar2,KVar8);
            ::rank::KeyValue::value_add((KeyValue *)local_108,local_118);
            if (local_118 == 0) {
              (__return_storage_ptr__->stats).random_access_miss =
                   (__return_storage_ptr__->stats).random_access_miss + 1;
            }
            else {
              (__return_storage_ptr__->stats).random_access_hit =
                   (__return_storage_ptr__->stats).random_access_hit + 1;
            }
          }
        }
        local_120 = ::rank::KeyValue::key((KeyValue *)local_108);
        pVar12 = std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)local_c0,&local_120);
        local_130._M_cur =
             (__node_type *)pVar12.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
        local_128 = pVar12.second;
        KVar8 = ::rank::KeyValue::key((KeyValue *)local_108);
        VVar3 = ::rank::KeyValue::value((KeyValue *)local_108);
        ::rank::KeyValue::KeyValue(&local_140,KVar8,VVar3);
        TopK::insert(&__return_storage_ptr__->topk,&local_140);
        if ((largest_rank != 0) &&
           (RVar11 = TopK::count_entries_above_or_equal(&__return_storage_ptr__->topk,m),
           largest_rank <= RVar11)) break;
        sVar10 = std::vector<Queue,_std::allocator<Queue>_>::size
                           ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
        q = (value_type *)((ulong)((long)&q->_rank + 1U) % sVar10);
      }
      else {
        (__return_storage_ptr__->stats).ordered_access_miss =
             (__return_storage_ptr__->stats).ordered_access_miss + 1;
      }
    }
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_c0);
  std::vector<Queue,_std::allocator<Queue>_>::~vector
            ((vector<Queue,_std::allocator<Queue>_> *)&head_sum);
  return __return_storage_ptr__;
}

Assistant:

ThresholdAlgorithmResult threshold_algorithm(const Problem *problem, RankSize k) {

        //
        struct Queue {
            Queue(const Rank* rank): _rank(rank) {};
            bool empty() const { return _index >= _rank->size(); }
            Value head_value() const { return _index < _rank->size() ? _rank->top(_index).value() : 0; }
            Value value_of(Key key) const { return _rank->value_of(key); }
            const Entry* next() {
                if (_index < _rank->size()) {
                    _head_value_drop = head_value();
                    auto &result = _rank->top(_index);
                    ++_index;
                    _head_value_drop -= head_value();
                    return &result;
                }
                else {
                    return nullptr;
                }
            }
            Value head_value_drop() const { return _head_value_drop; }
            Value _head_value_drop { 0 };
            const Rank* _rank;
            RankSize _index { 0 };
        };

        // create m queues
        Count largest_rank = 0;
        Count entries      = 0;
        
        std::vector<Queue> queues;
        Value              head_sum = 0;
        auto m = problem->size();
        queues.reserve(m);
        for (auto i=0;i<m;++i) {
            queues.push_back(Queue(problem->rank(i)));
            if (!queues.back().empty()) {
                head_sum += queues.back().head_value();
                
                auto rank_size = queues.back()._rank->size();
                largest_rank   = std::max(largest_rank, rank_size);
                entries       += rank_size;
                
                
            }
            else {
                queues.pop_back();
            }
        };

        std::unordered_set<Key> processed_keys;

        ThresholdAlgorithmResult result;
        result.topk.k(k);
        auto &topk  = result.topk;
        auto &stats = result.stats;

        stats.k            = k;
        stats.num_ranks    = problem->size();
        stats.largest_rank = largest_rank;
        stats.entries      = entries;

        std::size_t i = 0;
        while (i < queues.size()) {

            // for each queue generate next element
            auto &q = queues.at(i);

            auto top_record  = q.next();
            head_sum        -= q.head_value_drop();

            if ( top_record ) {
                if (!processed_keys.count(top_record->key())) {

                    ++stats.ordered_access_hit;

                    // if key has not beed processed
                    auto record = KeyValue { top_record->key(), top_record->value() };

                    // add all summands to record
                    for (auto j=0;j<queues.size();++j) {
                        if (i != j) {
                            auto value = queues[j].value_of(record.key());
                            record.value_add(value);
                            if (value) {
                                ++stats.random_access_hit;
                            }
                            else {
                                ++stats.random_access_miss;
                            }
                        }
                    }

                    processed_keys.insert(record.key());

                    topk.insert({record.key(), record.value()});

                    if (k && topk.count_entries_above_or_equal(head_sum) >= k) {
                        // proven that we have a valid set of topk entries
                        break;
                    }

                    i = (i + 1) % queues.size();
                }
                else {
                    ++stats.ordered_access_miss;
                }
            }
            else { // queue is emtpy
                std::swap(queues[i], queues.back());
                queues.pop_back();
                if (i >= queues.size()) {
                    i = 0;
                }
            }
        }

        return result;
    
    }